

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O0

int verifyPath(DirHandle *h,char **_fname,int allowMissing)

{
  int iVar1;
  PHYSFS_ErrorCode PVar2;
  size_t sVar3;
  size_t sVar4;
  char *pcVar5;
  bool bVar6;
  undefined1 local_88 [4];
  int rc;
  PHYSFS_Stat statbuf;
  int isempty;
  size_t len;
  size_t mntpntlen;
  char *end;
  char *start;
  char *pcStack_30;
  int retval;
  char *fname;
  int allowMissing_local;
  char **_fname_local;
  DirHandle *h_local;
  
  pcStack_30 = *_fname;
  if ((*pcStack_30 == '\0') && (h->root == (char *)0x0)) {
    return 1;
  }
  if (h->mountPoint != (char *)0x0) {
    sVar3 = strlen(h->mountPoint);
    sVar4 = strlen(pcStack_30);
    if (sVar3 < 2) {
      __assert_fail("mntpntlen > 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/jarikomppa[P]physfs_magicstream/src/physfs.c"
                    ,0x82c,"int verifyPath(DirHandle *, char **, int)");
    }
    if (sVar4 < sVar3 - 1) {
      PHYSFS_setErrorCode(PHYSFS_ERR_NOT_FOUND);
      return 0;
    }
    iVar1 = strncmp(h->mountPoint,pcStack_30,sVar3 - 1);
    if (iVar1 != 0) {
      PHYSFS_setErrorCode(PHYSFS_ERR_NOT_FOUND);
      return 0;
    }
    if ((sVar3 - 1 < sVar4) && (pcStack_30[sVar3 - 1] != '/')) {
      PHYSFS_setErrorCode(PHYSFS_ERR_NOT_FOUND);
      return 0;
    }
    pcStack_30 = pcStack_30 + (sVar3 - 1);
    if (*pcStack_30 == '/') {
      pcStack_30 = pcStack_30 + 1;
    }
    *_fname = pcStack_30;
  }
  start._4_4_ = 1;
  if (h->root != (char *)0x0) {
    statbuf.readonly = (int)(*pcStack_30 == '\0');
    pcStack_30 = pcStack_30 + -(h->rootlen - 1);
    strcpy(pcStack_30,h->root);
    if (statbuf.readonly == 0) {
      pcStack_30[h->rootlen - 2] = '/';
    }
    *_fname = pcStack_30;
  }
  end = pcStack_30;
  if (allowSymLinks == 0) {
    while( true ) {
      pcVar5 = strchr(end,0x2f);
      if (pcVar5 != (char *)0x0) {
        *pcVar5 = '\0';
      }
      iVar1 = (*h->funcs->stat)(h->opaque,pcStack_30,(PHYSFS_Stat *)local_88);
      if (iVar1 == 0) {
        PVar2 = currentErrorCode();
        if (PVar2 == PHYSFS_ERR_NOT_FOUND) {
          start._4_4_ = 0;
        }
        bVar6 = false;
      }
      else {
        bVar6 = (int)statbuf.accesstime == 2;
      }
      if (pcVar5 != (char *)0x0) {
        *pcVar5 = '/';
      }
      if (bVar6) {
        PHYSFS_setErrorCode(PHYSFS_ERR_SYMLINK_FORBIDDEN);
        return 0;
      }
      if (start._4_4_ == 0) break;
      if (pcVar5 == (char *)0x0) {
        return start._4_4_;
      }
      end = pcVar5 + 1;
    }
    if ((pcVar5 == (char *)0x0) || (allowMissing != 0)) {
      start._4_4_ = 1;
    }
  }
  return start._4_4_;
}

Assistant:

static int verifyPath(DirHandle *h, char **_fname, int allowMissing)
{
    char *fname = *_fname;
    int retval = 1;
    char *start;
    char *end;

    if ((*fname == '\0') && (!h->root))  /* quick rejection. */
        return 1;

    /* !!! FIXME: This codeblock sucks. */
    if (h->mountPoint != NULL)  /* NULL mountpoint means "/". */
    {
        size_t mntpntlen = strlen(h->mountPoint);
        size_t len = strlen(fname);
        assert(mntpntlen > 1); /* root mount points should be NULL. */
        /* not under the mountpoint, so skip this archive. */
        BAIL_IF(len < mntpntlen-1, PHYSFS_ERR_NOT_FOUND, 0);
        /* !!! FIXME: Case insensitive? */
        retval = strncmp(h->mountPoint, fname, mntpntlen-1);
        BAIL_IF(retval != 0, PHYSFS_ERR_NOT_FOUND, 0);
        if (len > mntpntlen-1)  /* corner case... */
            BAIL_IF(fname[mntpntlen-1]!='/', PHYSFS_ERR_NOT_FOUND, 0);
        fname += mntpntlen-1;  /* move to start of actual archive path. */
        if (*fname == '/')
            fname++;
        *_fname = fname;  /* skip mountpoint for later use. */
        retval = 1;  /* may be reset, below. */
    } /* if */

    /* prepend the root directory, if any. */
    if (h->root)
    {
        const int isempty = (*fname == '\0');
        fname -= h->rootlen - 1;
        strcpy(fname, h->root);
        if (!isempty)
            fname[h->rootlen - 2] = '/';
        *_fname = fname;
    } /* if */

    start = fname;
    if (!allowSymLinks)
    {
        while (1)
        {
            PHYSFS_Stat statbuf;
            int rc = 0;
            end = strchr(start, '/');

            if (end != NULL) *end = '\0';
            rc = h->funcs->stat(h->opaque, fname, &statbuf);
            if (rc)
                rc = (statbuf.filetype == PHYSFS_FILETYPE_SYMLINK);
            else if (currentErrorCode() == PHYSFS_ERR_NOT_FOUND)
                retval = 0;

            if (end != NULL) *end = '/';

            /* insecure path (has a disallowed symlink in it)? */
            BAIL_IF(rc, PHYSFS_ERR_SYMLINK_FORBIDDEN, 0);

            /* break out early if path element is missing. */
            if (!retval)
            {
                /*
                 * We need to clear it if it's the last element of the path,
                 *  since this might be a non-existant file we're opening
                 *  for writing...
                 */
                if ((end == NULL) || (allowMissing))
                    retval = 1;
                break;
            } /* if */

            if (end == NULL)
                break;

            start = end + 1;
        } /* while */
    } /* if */

    return retval;
}